

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

void __thiscall soplex::SPxSolverBase<double>::setPricing(SPxSolverBase<double> *this,Pricing pr)

{
  this->thePricing = pr;
  if ((this->initialized == true) && (this->theType == ENTER)) {
    computePvec(this);
    computeCoTest(this);
    computeTest(this);
    return;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setPricing(Pricing pr)
   {
      thePricing = pr;

      if(initialized && type() == ENTER)
      {
         computePvec();
         computeCoTest();
         computeTest();
      }
   }